

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhaplanner.cpp
# Opt level: O2

bool __thiscall MHAPlanner::time_limit_reached(MHAPlanner *this)

{
  double dVar1;
  bool bVar2;
  
  if ((this->m_params).return_first_solution == false) {
    dVar1 = (this->m_params).max_time;
    if ((dVar1 <= 0.0) || (bVar2 = true, this->m_elapsed < dVar1)) {
      return this->m_max_expansions <= this->m_num_expansions && 0 < this->m_max_expansions;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MHAPlanner::time_limit_reached() const
{
    if (m_params.return_first_solution) {
        return false;
    }
    else if (m_params.max_time > 0.0 && m_elapsed >= m_params.max_time) {
        return true;
    }
    else if (m_max_expansions > 0 && m_num_expansions >= m_max_expansions) {
        return true;
    }
    else {
        return false;
    }
}